

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jidctfst.c
# Opt level: O0

void jpeg_idct_ifast(j_decompress_ptr cinfo,jpeg_component_info *compptr,JCOEFPTR coef_block,
                    JSAMPARRAY output_buf,JDIMENSION output_col)

{
  undefined1 uVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  int iVar12;
  undefined1 *puVar13;
  long in_RCX;
  short *in_RDX;
  long in_RSI;
  long in_RDI;
  uint in_R8D;
  int ctr;
  JSAMPLE *range_limit;
  JSAMPROW outptr;
  int *wsptr;
  IFAST_MULT_TYPE *quantptr;
  JCOEFPTR inptr;
  DCTELEM z13;
  DCTELEM z12;
  DCTELEM z11;
  DCTELEM z10;
  DCTELEM z5;
  DCTELEM tmp13;
  DCTELEM tmp12;
  DCTELEM tmp11;
  DCTELEM tmp10;
  DCTELEM tmp7;
  DCTELEM tmp6;
  DCTELEM tmp5;
  DCTELEM tmp4;
  DCTELEM tmp3;
  DCTELEM tmp2;
  DCTELEM tmp1;
  DCTELEM tmp0;
  int local_178 [16];
  int local_138 [8];
  int local_118 [8];
  int local_f8 [8];
  int local_d8 [8];
  int local_b8 [8];
  int local_98 [8];
  JSAMPLE dcval_1;
  int dcval;
  long local_70;
  int *local_60;
  short *local_58;
  short *local_50;
  short local_34;
  short local_32;
  short local_30;
  short local_2e;
  short local_2c;
  short local_2a;
  short local_28;
  short local_26;
  uint local_24;
  long local_20;
  
  local_70 = *(long *)(in_RDI + 0x1a8) + 0x80;
  local_58 = *(short **)(in_RSI + 0x58);
  local_60 = local_178;
  local_50 = in_RDX;
  local_24 = in_R8D;
  local_20 = in_RCX;
  for (dcval = 8; 0 < dcval; dcval = dcval + -1) {
    if ((((local_50[8] == 0) && (local_50[0x10] == 0)) &&
        ((local_50[0x18] == 0 &&
         (((local_50[0x20] == 0 && (local_50[0x28] == 0)) && (local_50[0x30] == 0)))))) &&
       (local_50[0x38] == 0)) {
      iVar12 = (int)*local_50 * (int)*local_58;
      *local_60 = iVar12;
      local_60[8] = iVar12;
      local_60[0x10] = iVar12;
      local_60[0x18] = iVar12;
      local_60[0x20] = iVar12;
      local_60[0x28] = iVar12;
      local_60[0x30] = iVar12;
      local_60[0x38] = iVar12;
    }
    else {
      local_2c = *local_50 * *local_58 + local_50[0x20] * local_58[0x20];
      local_2a = *local_50 * *local_58 - local_50[0x20] * local_58[0x20];
      sVar2 = local_50[0x10] * local_58[0x10] + local_50[0x30] * local_58[0x30];
      sVar3 = (short)((ulong)((long)((int)(short)(local_50[0x10] * local_58[0x10]) -
                                    (int)(short)(local_50[0x30] * local_58[0x30])) * 0x16a) >> 8) -
              sVar2;
      local_26 = local_2c + sVar2;
      local_2c = local_2c - sVar2;
      local_28 = local_2a + sVar3;
      local_2a = local_2a - sVar3;
      sVar2 = local_50[0x28] * local_58[0x28] + local_50[0x18] * local_58[0x18];
      sVar3 = local_50[0x28] * local_58[0x28] - local_50[0x18] * local_58[0x18];
      sVar4 = local_50[8] * local_58[8] + local_50[0x38] * local_58[0x38];
      sVar5 = local_50[8] * local_58[8] - local_50[0x38] * local_58[0x38];
      local_34 = sVar4 + sVar2;
      sVar6 = (short)((ulong)((long)((int)sVar3 + (int)sVar5) * 0x1d9) >> 8);
      local_32 = ((short)((ulong)((long)sVar3 * -0x29d) >> 8) + sVar6) - local_34;
      local_30 = (short)((ulong)((long)((int)sVar4 - (int)sVar2) * 0x16a) >> 8) - local_32;
      local_2e = ((short)((ulong)((long)sVar5 * 0x115) >> 8) - sVar6) + local_30;
      *local_60 = (int)local_26 + (int)local_34;
      local_60[0x38] = (int)local_26 - (int)local_34;
      local_60[8] = (int)local_28 + (int)local_32;
      local_60[0x30] = (int)local_28 - (int)local_32;
      local_60[0x10] = (int)local_2a + (int)local_30;
      local_60[0x28] = (int)local_2a - (int)local_30;
      local_60[0x20] = (int)local_2c + (int)local_2e;
      local_60[0x18] = (int)local_2c - (int)local_2e;
    }
    local_50 = local_50 + 1;
    local_58 = local_58 + 1;
    local_60 = local_60 + 1;
  }
  local_60 = local_178;
  for (dcval = 0; dcval < 8; dcval = dcval + 1) {
    puVar13 = (undefined1 *)(*(long *)(local_20 + (long)dcval * 8) + (ulong)local_24);
    if ((((local_60[1] == 0) && (local_60[2] == 0)) && (local_60[3] == 0)) &&
       (((local_60[4] == 0 && (local_60[5] == 0)) && ((local_60[6] == 0 && (local_60[7] == 0)))))) {
      uVar1 = *(undefined1 *)(local_70 + (int)(*local_60 >> 5 & 0x3ff));
      *puVar13 = uVar1;
      puVar13[1] = uVar1;
      puVar13[2] = uVar1;
      puVar13[3] = uVar1;
      puVar13[4] = uVar1;
      puVar13[5] = uVar1;
      puVar13[6] = uVar1;
      puVar13[7] = uVar1;
    }
    else {
      sVar5 = (short)*local_60 + (short)local_60[4];
      sVar6 = (short)*local_60 - (short)local_60[4];
      sVar2 = (short)local_60[2] + (short)local_60[6];
      sVar3 = (short)((ulong)((long)((int)(short)local_60[2] - (int)(short)local_60[6]) * 0x16a) >>
                     8) - sVar2;
      sVar4 = sVar5 + sVar2;
      sVar5 = sVar5 - sVar2;
      sVar2 = sVar6 + sVar3;
      sVar6 = sVar6 - sVar3;
      sVar3 = (short)local_60[5] + (short)local_60[3];
      sVar7 = (short)local_60[5] - (short)local_60[3];
      sVar8 = (short)local_60[1] + (short)local_60[7];
      sVar9 = (short)local_60[1] - (short)local_60[7];
      sVar10 = sVar8 + sVar3;
      sVar11 = (short)((ulong)((long)((int)sVar7 + (int)sVar9) * 0x1d9) >> 8);
      sVar7 = ((short)((ulong)((long)sVar7 * -0x29d) >> 8) + sVar11) - sVar10;
      sVar3 = (short)((ulong)((long)((int)sVar8 - (int)sVar3) * 0x16a) >> 8) - sVar7;
      sVar8 = ((short)((ulong)((long)sVar9 * 0x115) >> 8) - sVar11) + sVar3;
      *puVar13 = *(undefined1 *)(local_70 + (int)((int)sVar4 + (int)sVar10 >> 5 & 0x3ff));
      puVar13[7] = *(undefined1 *)(local_70 + (int)((int)sVar4 - (int)sVar10 >> 5 & 0x3ff));
      puVar13[1] = *(undefined1 *)(local_70 + (int)((int)sVar2 + (int)sVar7 >> 5 & 0x3ff));
      puVar13[6] = *(undefined1 *)(local_70 + (int)((int)sVar2 - (int)sVar7 >> 5 & 0x3ff));
      puVar13[2] = *(undefined1 *)(local_70 + (int)((int)sVar6 + (int)sVar3 >> 5 & 0x3ff));
      puVar13[5] = *(undefined1 *)(local_70 + (int)((int)sVar6 - (int)sVar3 >> 5 & 0x3ff));
      puVar13[4] = *(undefined1 *)(local_70 + (int)((int)sVar5 + (int)sVar8 >> 5 & 0x3ff));
      puVar13[3] = *(undefined1 *)(local_70 + (int)((int)sVar5 - (int)sVar8 >> 5 & 0x3ff));
    }
    local_60 = local_60 + 8;
  }
  return;
}

Assistant:

GLOBAL(void)
jpeg_idct_ifast(j_decompress_ptr cinfo, jpeg_component_info *compptr,
                JCOEFPTR coef_block, JSAMPARRAY output_buf,
                JDIMENSION output_col)
{
  DCTELEM tmp0, tmp1, tmp2, tmp3, tmp4, tmp5, tmp6, tmp7;
  DCTELEM tmp10, tmp11, tmp12, tmp13;
  DCTELEM z5, z10, z11, z12, z13;
  JCOEFPTR inptr;
  IFAST_MULT_TYPE *quantptr;
  int *wsptr;
  JSAMPROW outptr;
  JSAMPLE *range_limit = IDCT_range_limit(cinfo);
  int ctr;
  int workspace[DCTSIZE2];      /* buffers data between passes */
  SHIFT_TEMPS                   /* for DESCALE */
  ISHIFT_TEMPS                  /* for IDESCALE */

  /* Pass 1: process columns from input, store into work array. */

  inptr = coef_block;
  quantptr = (IFAST_MULT_TYPE *)compptr->dct_table;
  wsptr = workspace;
  for (ctr = DCTSIZE; ctr > 0; ctr--) {
    /* Due to quantization, we will usually find that many of the input
     * coefficients are zero, especially the AC terms.  We can exploit this
     * by short-circuiting the IDCT calculation for any column in which all
     * the AC terms are zero.  In that case each output is equal to the
     * DC coefficient (with scale factor as needed).
     * With typical images and quantization tables, half or more of the
     * column DCT calculations can be simplified this way.
     */

    if (inptr[DCTSIZE * 1] == 0 && inptr[DCTSIZE * 2] == 0 &&
        inptr[DCTSIZE * 3] == 0 && inptr[DCTSIZE * 4] == 0 &&
        inptr[DCTSIZE * 5] == 0 && inptr[DCTSIZE * 6] == 0 &&
        inptr[DCTSIZE * 7] == 0) {
      /* AC terms all zero */
      int dcval = (int)DEQUANTIZE(inptr[DCTSIZE * 0], quantptr[DCTSIZE * 0]);

      wsptr[DCTSIZE * 0] = dcval;
      wsptr[DCTSIZE * 1] = dcval;
      wsptr[DCTSIZE * 2] = dcval;
      wsptr[DCTSIZE * 3] = dcval;
      wsptr[DCTSIZE * 4] = dcval;
      wsptr[DCTSIZE * 5] = dcval;
      wsptr[DCTSIZE * 6] = dcval;
      wsptr[DCTSIZE * 7] = dcval;

      inptr++;                  /* advance pointers to next column */
      quantptr++;
      wsptr++;
      continue;
    }

    /* Even part */

    tmp0 = DEQUANTIZE(inptr[DCTSIZE * 0], quantptr[DCTSIZE * 0]);
    tmp1 = DEQUANTIZE(inptr[DCTSIZE * 2], quantptr[DCTSIZE * 2]);
    tmp2 = DEQUANTIZE(inptr[DCTSIZE * 4], quantptr[DCTSIZE * 4]);
    tmp3 = DEQUANTIZE(inptr[DCTSIZE * 6], quantptr[DCTSIZE * 6]);

    tmp10 = tmp0 + tmp2;        /* phase 3 */
    tmp11 = tmp0 - tmp2;

    tmp13 = tmp1 + tmp3;        /* phases 5-3 */
    tmp12 = MULTIPLY(tmp1 - tmp3, FIX_1_414213562) - tmp13; /* 2*c4 */

    tmp0 = tmp10 + tmp13;       /* phase 2 */
    tmp3 = tmp10 - tmp13;
    tmp1 = tmp11 + tmp12;
    tmp2 = tmp11 - tmp12;

    /* Odd part */

    tmp4 = DEQUANTIZE(inptr[DCTSIZE * 1], quantptr[DCTSIZE * 1]);
    tmp5 = DEQUANTIZE(inptr[DCTSIZE * 3], quantptr[DCTSIZE * 3]);
    tmp6 = DEQUANTIZE(inptr[DCTSIZE * 5], quantptr[DCTSIZE * 5]);
    tmp7 = DEQUANTIZE(inptr[DCTSIZE * 7], quantptr[DCTSIZE * 7]);

    z13 = tmp6 + tmp5;          /* phase 6 */
    z10 = tmp6 - tmp5;
    z11 = tmp4 + tmp7;
    z12 = tmp4 - tmp7;

    tmp7 = z11 + z13;           /* phase 5 */
    tmp11 = MULTIPLY(z11 - z13, FIX_1_414213562); /* 2*c4 */

    z5 = MULTIPLY(z10 + z12, FIX_1_847759065); /* 2*c2 */
    tmp10 = MULTIPLY(z12, FIX_1_082392200) - z5; /* 2*(c2-c6) */
    tmp12 = MULTIPLY(z10, -FIX_2_613125930) + z5; /* -2*(c2+c6) */

    tmp6 = tmp12 - tmp7;        /* phase 2 */
    tmp5 = tmp11 - tmp6;
    tmp4 = tmp10 + tmp5;

    wsptr[DCTSIZE * 0] = (int)(tmp0 + tmp7);
    wsptr[DCTSIZE * 7] = (int)(tmp0 - tmp7);
    wsptr[DCTSIZE * 1] = (int)(tmp1 + tmp6);
    wsptr[DCTSIZE * 6] = (int)(tmp1 - tmp6);
    wsptr[DCTSIZE * 2] = (int)(tmp2 + tmp5);
    wsptr[DCTSIZE * 5] = (int)(tmp2 - tmp5);
    wsptr[DCTSIZE * 4] = (int)(tmp3 + tmp4);
    wsptr[DCTSIZE * 3] = (int)(tmp3 - tmp4);

    inptr++;                    /* advance pointers to next column */
    quantptr++;
    wsptr++;
  }

  /* Pass 2: process rows from work array, store into output array. */
  /* Note that we must descale the results by a factor of 8 == 2**3, */
  /* and also undo the PASS1_BITS scaling. */

  wsptr = workspace;
  for (ctr = 0; ctr < DCTSIZE; ctr++) {
    outptr = output_buf[ctr] + output_col;
    /* Rows of zeroes can be exploited in the same way as we did with columns.
     * However, the column calculation has created many nonzero AC terms, so
     * the simplification applies less often (typically 5% to 10% of the time).
     * On machines with very fast multiplication, it's possible that the
     * test takes more time than it's worth.  In that case this section
     * may be commented out.
     */

#ifndef NO_ZERO_ROW_TEST
    if (wsptr[1] == 0 && wsptr[2] == 0 && wsptr[3] == 0 && wsptr[4] == 0 &&
        wsptr[5] == 0 && wsptr[6] == 0 && wsptr[7] == 0) {
      /* AC terms all zero */
      JSAMPLE dcval =
        range_limit[IDESCALE(wsptr[0], PASS1_BITS + 3) & RANGE_MASK];

      outptr[0] = dcval;
      outptr[1] = dcval;
      outptr[2] = dcval;
      outptr[3] = dcval;
      outptr[4] = dcval;
      outptr[5] = dcval;
      outptr[6] = dcval;
      outptr[7] = dcval;

      wsptr += DCTSIZE;         /* advance pointer to next row */
      continue;
    }
#endif

    /* Even part */

    tmp10 = ((DCTELEM)wsptr[0] + (DCTELEM)wsptr[4]);
    tmp11 = ((DCTELEM)wsptr[0] - (DCTELEM)wsptr[4]);

    tmp13 = ((DCTELEM)wsptr[2] + (DCTELEM)wsptr[6]);
    tmp12 =
      MULTIPLY((DCTELEM)wsptr[2] - (DCTELEM)wsptr[6], FIX_1_414213562) - tmp13;

    tmp0 = tmp10 + tmp13;
    tmp3 = tmp10 - tmp13;
    tmp1 = tmp11 + tmp12;
    tmp2 = tmp11 - tmp12;

    /* Odd part */

    z13 = (DCTELEM)wsptr[5] + (DCTELEM)wsptr[3];
    z10 = (DCTELEM)wsptr[5] - (DCTELEM)wsptr[3];
    z11 = (DCTELEM)wsptr[1] + (DCTELEM)wsptr[7];
    z12 = (DCTELEM)wsptr[1] - (DCTELEM)wsptr[7];

    tmp7 = z11 + z13;           /* phase 5 */
    tmp11 = MULTIPLY(z11 - z13, FIX_1_414213562); /* 2*c4 */

    z5 = MULTIPLY(z10 + z12, FIX_1_847759065); /* 2*c2 */
    tmp10 = MULTIPLY(z12, FIX_1_082392200) - z5; /* 2*(c2-c6) */
    tmp12 = MULTIPLY(z10, -FIX_2_613125930) + z5; /* -2*(c2+c6) */

    tmp6 = tmp12 - tmp7;        /* phase 2 */
    tmp5 = tmp11 - tmp6;
    tmp4 = tmp10 + tmp5;

    /* Final output stage: scale down by a factor of 8 and range-limit */

    outptr[0] =
      range_limit[IDESCALE(tmp0 + tmp7, PASS1_BITS + 3) & RANGE_MASK];
    outptr[7] =
      range_limit[IDESCALE(tmp0 - tmp7, PASS1_BITS + 3) & RANGE_MASK];
    outptr[1] =
      range_limit[IDESCALE(tmp1 + tmp6, PASS1_BITS + 3) & RANGE_MASK];
    outptr[6] =
      range_limit[IDESCALE(tmp1 - tmp6, PASS1_BITS + 3) & RANGE_MASK];
    outptr[2] =
      range_limit[IDESCALE(tmp2 + tmp5, PASS1_BITS + 3) & RANGE_MASK];
    outptr[5] =
      range_limit[IDESCALE(tmp2 - tmp5, PASS1_BITS + 3) & RANGE_MASK];
    outptr[4] =
      range_limit[IDESCALE(tmp3 + tmp4, PASS1_BITS + 3) & RANGE_MASK];
    outptr[3] =
      range_limit[IDESCALE(tmp3 - tmp4, PASS1_BITS + 3) & RANGE_MASK];

    wsptr += DCTSIZE;           /* advance pointer to next row */
  }
}